

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityMarking.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::EntityMarking::Decode(EntityMarking *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  ushort local_50;
  KUINT16 i;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  EntityMarking *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 0xc) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  KDataStream::operator>>(local_18,&this->m_ui8EntityMarkingCharacterSet);
  for (local_50 = 0; local_50 < 0xb; local_50 = local_50 + 1) {
    KDataStream::operator>>(local_18,this->m_sEntityMarkingString + local_50);
  }
  return;
}

Assistant:

void EntityMarking::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < ENTITY_MARKING_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui8EntityMarkingCharacterSet;

    for( KUINT16 i = 0; i < 11; ++i )
    {
        stream >> m_sEntityMarkingString[i];
    }
}